

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access-control.c
# Opt level: O0

void ndn_ac_register_encryption_key_request(uint8_t service)

{
  int local_10;
  int i;
  uint8_t service_local;
  
  if (!_ac_initialized) {
    _init_ac_state();
  }
  local_10 = 0;
  while( true ) {
    if (9 < local_10) {
      return;
    }
    if (_ac_self_state.self_services[local_10] == 0xff) break;
    local_10 = local_10 + 1;
  }
  _ac_self_state.self_services[local_10] = service;
  return;
}

Assistant:

void
ndn_ac_register_encryption_key_request(uint8_t service)
{
  if (!_ac_initialized) {
    _init_ac_state();
  }
  for (int i = 0; i < 10; i++) {
    if (_ac_self_state.self_services[i] == NDN_SD_NONE) {
      _ac_self_state.self_services[i] = service;
      return;
    }
  }
}